

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O2

int __thiscall
vkt::anon_unknown_0::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ulong uVar1;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderCaseFactory caseFactory;
  _Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_38;
  ShaderCaseFactory local_20;
  TestContext *local_18;
  
  local_18 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
  local_20._vptr_ShaderCaseFactory = (_func_int **)&PTR_createGroup_00bf34e8;
  glu::sl::parseFile((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_38,
                     local_18->m_curArchive,&this->m_filename,&local_20);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_38._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar1 = uVar1 + 1) {
    tcu::TestNode::addChild
              ((TestNode *)this,local_38._M_impl.super__Vector_impl_data._M_start[uVar1]);
  }
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base(&local_38);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		ShaderCaseFactory				caseFactory	(m_testCtx);
		const vector<tcu::TestNode*>	children	= glu::sl::parseFile(m_testCtx.getArchive(), m_filename, &caseFactory);

		for (size_t ndx = 0; ndx < children.size(); ndx++)
		{
			try
			{
				addChild(children[ndx]);
			}
			catch (...)
			{
				for (; ndx < children.size(); ndx++)
					delete children[ndx];
				throw;
			}
		}
	}